

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImU32 ImGui::ColorConvertFloat4ToU32(ImVec4 *in)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  
  fVar1 = in->x;
  fVar2 = in->y;
  fVar7 = 1.0;
  if (fVar1 <= 1.0) {
    fVar7 = fVar1;
  }
  fVar5 = 1.0;
  if (fVar2 <= 1.0) {
    fVar5 = fVar2;
  }
  uVar3 = in->z;
  uVar4 = in->w;
  auVar6._4_4_ = uVar4;
  auVar6._0_4_ = uVar3;
  auVar6._8_8_ = 0;
  auVar6 = minps(_DAT_0015f460,auVar6);
  return (int)((float)(-(uint)(0.0 <= (float)uVar4) & auVar6._4_4_) * 255.0 + 0.5) * 0x1000000 |
         (int)((float)(-(uint)(0.0 <= (float)uVar3) & auVar6._0_4_) * 255.0 + 0.5) << 0x10 |
         (int)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar5) * 255.0 + 0.5) << 8 |
         (int)((float)(~-(uint)(fVar1 < 0.0) & (uint)fVar7) * 255.0 + 0.5);
}

Assistant:

ImU32 ImGui::ColorConvertFloat4ToU32(const ImVec4& in)
{
    ImU32 out;
    out  = ((ImU32)IM_F32_TO_INT8_SAT(in.x)) << IM_COL32_R_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.y)) << IM_COL32_G_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.z)) << IM_COL32_B_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.w)) << IM_COL32_A_SHIFT;
    return out;
}